

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall RTree::showAll_values_JSON(RTree *this,RTree_node *node,int level,string *json)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  RTree *local_90;
  string local_88;
  vector<Point,_std::allocator<Point>_> vertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = this;
  if (node->is_leaf == false) {
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < node->elements; lVar2 = lVar2 + 1) {
      std::__cxx11::string::append((char *)json);
      std::__cxx11::to_string(&local_110,node->at_level);
      std::operator+(&local_d0,"\"level\":",&local_110);
      std::operator+(&local_f0,&local_d0,",\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::to_string(&local_110,0);
      std::operator+(&local_d0,"\"is_leaf\":",&local_110);
      std::operator+(&local_f0,&local_d0,",\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::to_string
                (&local_110,
                 *(int *)(*(long *)((long)&((node->data_internal_node).
                                            super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->region +
                                   lVar3) + 0x10));
      std::operator+(&local_d0,"\"key\":",&local_110);
      std::operator+(&local_f0,&local_d0,",\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::append((char *)json);
      std::__cxx11::to_string
                (&local_88,
                 **(int **)((long)&((node->data_internal_node).
                                    super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->region + lVar3));
      std::operator+(&local_50,"[",&local_88);
      std::operator+(&local_110,&local_50,",");
      std::__cxx11::to_string
                (&local_b0,
                 *(int *)(*(long *)((long)&((node->data_internal_node).
                                            super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->region +
                                   lVar3) + 4));
      std::operator+(&local_d0,&local_110,&local_b0);
      std::operator+(&local_f0,&local_d0,"],\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::to_string
                (&local_88,
                 *(int *)(*(long *)((long)&((node->data_internal_node).
                                            super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->region +
                                   lVar3) + 8));
      std::operator+(&local_50,"[",&local_88);
      std::operator+(&local_110,&local_50,",");
      std::__cxx11::to_string
                (&local_b0,
                 *(int *)(*(long *)((long)&((node->data_internal_node).
                                            super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->region +
                                   lVar3) + 0xc));
      std::operator+(&local_d0,&local_110,&local_b0);
      std::operator+(&local_f0,&local_d0,"]\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      showAll_values_JSON(local_90,*(RTree_node **)
                                    ((long)&((node->data_internal_node).
                                             super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->child +
                                    lVar3),level + 1,json);
      lVar3 = lVar3 + 0x10;
    }
  }
  else {
    for (lVar2 = 0; lVar2 < node->elements; lVar2 = lVar2 + 1) {
      std::__cxx11::string::append((char *)json);
      std::__cxx11::to_string(&local_110,node->at_level);
      std::operator+(&local_d0,"\"level\":",&local_110);
      std::operator+(&local_f0,&local_d0,",\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::to_string(&local_110,1);
      std::operator+(&local_d0,"\"is_leaf\":",&local_110);
      std::operator+(&local_f0,&local_d0,",\n");
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::append((char *)json);
      Polygon::get_vertices
                (&vertices,
                 (node->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2].polygon);
      std::__cxx11::string::append((char *)json);
      uVar1 = 0;
      while( true ) {
        Polygon::get_vertices
                  ((vector<Point,_std::allocator<Point>_> *)&local_f0,
                   (node->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2].polygon);
        lVar3 = local_f0._M_string_length - (long)local_f0._M_dataplus._M_p;
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)&local_f0);
        if ((ulong)(lVar3 >> 3) <= uVar1) break;
        std::__cxx11::to_string
                  (&local_88,
                   vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1].X);
        std::operator+(&local_50,"[",&local_88);
        std::operator+(&local_110,&local_50,",");
        std::__cxx11::to_string
                  (&local_b0,
                   vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1].Y);
        std::operator+(&local_d0,&local_110,&local_b0);
        std::operator+(&local_f0,&local_d0,"]");
        std::__cxx11::string::append((string *)json);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_88);
        Polygon::get_vertices
                  ((vector<Point,_std::allocator<Point>_> *)&local_f0,
                   (node->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2].polygon);
        uVar1 = uVar1 + 1;
        lVar3 = local_f0._M_string_length - (long)local_f0._M_dataplus._M_p;
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)&local_f0);
        if (uVar1 != lVar3 >> 3) {
          std::__cxx11::string::append((char *)json);
        }
      }
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                (&vertices.super__Vector_base<Point,_std::allocator<Point>_>);
    }
  }
  return;
}

Assistant:

void RTree::showAll_values_JSON(RTree_node *node, int level, std::string &json)
{
    if(!node->is_leaf)
    {
        for(int i=0; i<node->elements; i++)
        {
            
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(0)+",\n";
            json += "\"key\":"+std::to_string(node->data_internal_node[i].region->get_key())+",\n";
            json += "\"elements\":[";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmin().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmin().get_Y())+"],\n";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmax().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmax().get_Y())+"]\n";
            json +="]}";
            json +=",";
            showAll_values_JSON(node->data_internal_node[i].child, level+1, json);

        }
    }
    else
    {
        for(int i=0; i<node->elements; i++)
        {
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(1)+",\n";
            json += "\"elements\":[";
            std::vector<Point> vertices = node->data_leafs[i].polygon->get_vertices();
            json += "[";
            for(int j=0; j<node->data_leafs[i].polygon->get_vertices().size(); j++)
            {
            json +="["+std::to_string(vertices[j].get_X())+","+std::to_string(vertices[j].get_Y())+"]";
            if(j+1 != node->data_leafs[i].polygon->get_vertices().size())
                    json += ",\n";
            }
            json += "]";
            json +="]}";
            json +=",";
        }
    }
}